

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

int __thiscall QDockWidgetLayout::minimumTitleWidth(QDockWidgetLayout *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QDockWidget *pQVar8;
  QDockWidgetLayout *this_00;
  undefined4 extraout_var;
  const_reference ppQVar9;
  undefined4 extraout_var_00;
  QStyle *pQVar10;
  long in_RDI;
  long in_FS_OFFSET;
  int fw;
  int mw;
  int titleHeight;
  QLayoutItem *item_1;
  QLayoutItem *item;
  QWidget *title;
  QDockWidget *q;
  QSize floatSize;
  QSize closeSize;
  int in_stack_ffffffffffffff78;
  DockWidgetFeature in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 uVar11;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget((QLayout *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  pQVar8 = qobject_cast<QDockWidget*>((QObject *)0x58afe8);
  this_00 = (QDockWidgetLayout *)
            widgetForRole((QDockWidgetLayout *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (Role)((ulong)in_RDI >> 0x20));
  if (this_00 == (QDockWidgetLayout *)0x0) {
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    bVar2 = hasFeature((QDockWidget *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
    if (bVar2) {
      ppQVar9 = QList<QLayoutItem_*>::operator[]
                          ((QList<QLayoutItem_*> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (*ppQVar9 != (QLayoutItem *)0x0) {
        iVar3 = (*(*ppQVar9)->_vptr_QLayoutItem[0xd])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x70))();
      }
    }
    bVar2 = hasFeature((QDockWidget *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
    if (bVar2) {
      ppQVar9 = QList<QLayoutItem_*>::operator[]
                          ((QList<QLayoutItem_*> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (*ppQVar9 != (QLayoutItem *)0x0) {
        iVar3 = (*(*ppQVar9)->_vptr_QLayoutItem[0xd])();
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x70))();
      }
    }
    uVar11 = (undefined1)((uint)in_stack_ffffffffffffff84 >> 0x18);
    iVar3 = QDockWidgetLayout::titleHeight(this_00);
    pQVar10 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar4 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x46,0,pQVar8);
    pQVar10 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar5 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x12,0,pQVar8);
    iVar6 = pick((bool)uVar11,(QSize *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                );
    iVar7 = pick((bool)uVar11,(QSize *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                );
    local_34 = iVar6 + iVar7 + iVar3 + iVar5 * 2 + iVar4 * 3;
  }
  else {
    uVar11 = *(undefined1 *)(in_RDI + 0x1c);
    (**(code **)(*(long *)&this_00->super_QLayout + 0x78))();
    local_34 = pick((bool)uVar11,
                    (QSize *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

int QDockWidgetLayout::minimumTitleWidth() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return pick(verticalTitleBar, title->minimumSizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (hasFeature(q, QDockWidget::DockWidgetClosable)) {
        if (QLayoutItem *item = item_list[CloseButton])
            closeSize = item->widget()->sizeHint();
    }
    if (hasFeature(q, QDockWidget::DockWidgetFloatable)) {
        if (QLayoutItem *item = item_list[FloatButton])
            floatSize = item->widget()->sizeHint();
    }

    int titleHeight = this->titleHeight();

    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);
    int fw = q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q);

    return pick(verticalTitleBar, closeSize)
            + pick(verticalTitleBar, floatSize)
            + titleHeight + 2*fw + 3*mw;
}